

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O3

void __thiscall
llbuild::core::DependencyKeyIDs::append(DependencyKeyIDs *this,DependencyKeyIDs *rhs)

{
  std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>>
            ((vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>> *)this,
             (this->keys).
             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (rhs->keys).
             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl
             .super__Vector_impl_data._M_start,
             (rhs->keys).
             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl
             .super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->flags,
             (this->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (rhs->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (rhs->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void append(const DependencyKeyIDs &rhs) {
    keys.insert(keys.end(), rhs.keys.begin(), rhs.keys.end());
    flags.insert(flags.end(), rhs.flags.begin(), rhs.flags.end());
  }